

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

SockaddrAny __thiscall
perfetto::base::anon_unknown_0::MakeSockAddr
          (anon_unknown_0 *this,SockFamily family,string *socket_name)

{
  uint uVar1;
  code *pcVar2;
  int iVar3;
  ulong __n;
  void *__src;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  uint *puVar7;
  int *piVar8;
  char *pcVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar10;
  SockaddrAny SVar11;
  undefined1 local_228 [8];
  addrinfo hints_1;
  addrinfo *addr_info_1;
  string local_1e8;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port;
  string local_1a8;
  undefined1 local_188 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  address;
  string local_168;
  undefined1 local_148 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts_1;
  undefined1 local_128 [8];
  addrinfo hints;
  addrinfo *addr_info;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  socklen_t size;
  size_t name_len;
  sockaddr_un saddr;
  string *socket_name_local;
  SockFamily family_local;
  SockaddrAny *res;
  
  saddr.sun_path._100_8_ = socket_name;
  if (family == kUnix) {
    memset((void *)((long)&name_len + 2),0,0x6e);
    __n = ::std::__cxx11::string::size();
    if (__n < 0x6c) {
      __src = (void *)::std::__cxx11::string::data();
      memcpy((void *)((long)&name_len + 4),__src,__n);
      if (name_len._4_1_ == '@') {
        name_len._4_1_ = '\0';
      }
      name_len._2_2_ = 1;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)__n + 3;
      if (0x6e < parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        pcVar6 = Basename(
                         "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                         );
        puVar7 = (uint *)__errno_location();
        uVar1 = *puVar7;
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        LogMessage(kLogError,pcVar6,0x106dc,"%s (errno: %d, %s)",
                   "PERFETTO_CHECK(static_cast<size_t>(size) <= sizeof(saddr))",(ulong)uVar1,pcVar9)
        ;
        MaybeSerializeLastLogsForCrashReporting();
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      SockaddrAny::SockaddrAny
                ((SockaddrAny *)this,(void *)((long)&name_len + 2),
                 parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      uVar10 = extraout_RDX_00;
    }
    else {
      piVar8 = __errno_location();
      *piVar8 = 0x24;
      SockaddrAny::SockaddrAny((SockaddrAny *)this);
      uVar10 = extraout_RDX;
    }
  }
  else if (family == kInet) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,":",&local_d9);
    SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8,socket_name,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::allocator<char>::~allocator(&local_d9);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8);
    if (sVar4 != 2) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106e1,"%s (errno: %d, %s)","PERFETTO_CHECK(parts.size() == 2)",
                 (ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    hints.ai_next = (addrinfo *)0x0;
    memset(local_128,0,0x30);
    local_128._4_4_ = 2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8,0);
    pcVar6 = (char *)::std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8,1);
    pcVar9 = (char *)::std::__cxx11::string::c_str();
    iVar3 = getaddrinfo(pcVar6,pcVar9,(addrinfo *)local_128,(addrinfo **)&hints.ai_next);
    if (iVar3 != 0) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106e6,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if ((hints.ai_next)->ai_family != 2) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106e7,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET)",(ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    parts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    SockaddrAny::SockaddrAny
              ((SockaddrAny *)this,(hints.ai_next)->ai_addr,(hints.ai_next)->ai_addrlen);
    freeaddrinfo((addrinfo *)hints.ai_next);
    parts_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
    uVar10 = extraout_RDX_01;
  }
  else {
    if (family != kInet6) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x10700,"%s (errno: %d, %s)","PERFETTO_CHECK(false)",(ulong)uVar1,
                 pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"]",
               (allocator<char> *)
               ((long)&address.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148,socket_name,&local_168);
    ::std::__cxx11::string::~string((string *)&local_168);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&address.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_148);
    if (sVar4 != 2) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106ef,"%s (errno: %d, %s)","PERFETTO_CHECK(parts.size() == 2)",
                 (ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_148,0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"[",
               (allocator<char> *)
               ((long)&port.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188,pvVar5,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&port.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_188);
    if (sVar4 != 1) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106f1,"%s (errno: %d, %s)","PERFETTO_CHECK(address.size() == 1)"
                 ,(ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_148,1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,":",(allocator<char> *)((long)&addr_info_1 + 7));
    SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c8,pvVar5,&local_1e8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&addr_info_1 + 7));
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c8);
    if (sVar4 != 1) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106f3,"%s (errno: %d, %s)","PERFETTO_CHECK(port.size() == 1)",
                 (ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    hints_1.ai_next = (addrinfo *)0x0;
    memset(local_228,0,0x30);
    local_228._4_4_ = 10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_188,0);
    pcVar6 = (char *)::std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8,0);
    pcVar9 = (char *)::std::__cxx11::string::c_str();
    iVar3 = getaddrinfo(pcVar6,pcVar9,(addrinfo *)local_228,(addrinfo **)&hints_1.ai_next);
    if (iVar3 != 0) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106f8,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if ((hints_1.ai_next)->ai_family != 10) {
      pcVar6 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      LogMessage(kLogError,pcVar6,0x106f9,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET6)",(ulong)uVar1,pcVar9);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    SockaddrAny::SockaddrAny
              ((SockaddrAny *)this,(hints_1.ai_next)->ai_addr,(hints_1.ai_next)->ai_addrlen);
    freeaddrinfo((addrinfo *)hints_1.ai_next);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
    uVar10 = extraout_RDX_02;
  }
  SVar11._8_8_ = uVar10;
  SVar11.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)this;
  return SVar11;
}

Assistant:

SockaddrAny MakeSockAddr(SockFamily family, const std::string& socket_name) {
  switch (family) {
    case SockFamily::kUnix: {
      struct sockaddr_un saddr {};
      const size_t name_len = socket_name.size();
      if (name_len >= sizeof(saddr.sun_path)) {
        errno = ENAMETOOLONG;
        return SockaddrAny();
      }
      memcpy(saddr.sun_path, socket_name.data(), name_len);
      if (saddr.sun_path[0] == '@') {
        saddr.sun_path[0] = '\0';
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
        // The MSDN blog claims that abstract (non-filesystem based) AF_UNIX
        // socket are supported, but that doesn't seem true.
        PERFETTO_ELOG(
            "Abstract AF_UNIX sockets are not supported on Windows, see "
            "https://github.com/microsoft/WSL/issues/4240");
        return SockaddrAny{};
#endif
      }
      saddr.sun_family = AF_UNIX;
      auto size = static_cast<socklen_t>(
          __builtin_offsetof(sockaddr_un, sun_path) + name_len + 1);
      PERFETTO_CHECK(static_cast<size_t>(size) <= sizeof(saddr));
      return SockaddrAny(&saddr, size);
    }
    case SockFamily::kInet: {
      auto parts = SplitString(socket_name, ":");
      PERFETTO_CHECK(parts.size() == 2);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET;
      PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
    case SockFamily::kInet6: {
      auto parts = SplitString(socket_name, "]");
      PERFETTO_CHECK(parts.size() == 2);
      auto address = SplitString(parts[0], "[");
      PERFETTO_CHECK(address.size() == 1);
      auto port = SplitString(parts[1], ":");
      PERFETTO_CHECK(port.size() == 1);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET6;
      PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET6);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
  }
  PERFETTO_CHECK(false);  // For GCC.
}